

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.cpp
# Opt level: O0

void __thiscall
duckdb::SplitStringListOperation::HandleValue
          (SplitStringListOperation *this,char *buf,idx_t start,idx_t end)

{
  bool bVar1;
  undefined8 *puVar2;
  long *in_RDI;
  string_t sVar3;
  idx_t in_stack_00000068;
  idx_t in_stack_00000070;
  char *in_stack_00000078;
  Vector *in_stack_00000080;
  undefined1 in_stack_ffffffffffffffd0 [16];
  
  bVar1 = IsNull(in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_,(idx_t)in_RDI);
  if (bVar1) {
    FlatVector::SetNull((Vector *)this,(idx_t)buf,start._7_1_);
    *(long *)in_RDI[1] = *(long *)in_RDI[1] + 1;
  }
  else {
    sVar3 = HandleString<true>(in_stack_00000080,in_stack_00000078,in_stack_00000070,
                               in_stack_00000068);
    puVar2 = (undefined8 *)(*in_RDI + *(long *)in_RDI[1] * 0x10);
    *puVar2 = sVar3.value._0_8_;
    puVar2[1] = sVar3.value._8_8_;
    *(long *)in_RDI[1] = *(long *)in_RDI[1] + 1;
  }
  return;
}

Assistant:

void HandleValue(const char *buf, idx_t start, idx_t end) {
		if (IsNull(buf, start, end)) {
			FlatVector::SetNull(child, entry_count, true);
			entry_count++;
			return;
		}
		child_data[entry_count] = HandleString(child, buf, start, end);
		entry_count++;
	}